

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

FlagTypes Js::ConfigFlagsTable::GetFlagType(Flag flag)

{
  FlagTypes local_c;
  Flag flag_local;
  
  switch(flag) {
  case ArrayValidateFlag:
    local_c = FlagBoolean;
    break;
  case MemOpMissingValueValidateFlag:
    local_c = FlagBoolean;
    break;
  case OOPJITFixupValidateFlag:
    local_c = FlagBoolean;
    break;
  case ArenaNoFreeListFlag:
    local_c = FlagBoolean;
    break;
  case ArenaNoPageReuseFlag:
    local_c = FlagBoolean;
    break;
  case ArenaUseHeapAllocFlag:
    local_c = FlagBoolean;
    break;
  case ValidateInlineStackFlag:
    local_c = FlagBoolean;
    break;
  case AsmDiffFlag:
    local_c = FlagBoolean;
    break;
  case AsmDumpModeFlag:
    local_c = FlagString;
    break;
  case AsmJsFlag:
    local_c = FlagBoolean;
    break;
  case AsmJsStopOnErrorFlag:
    local_c = FlagBoolean;
    break;
  case AsmJsEdgeFlag:
    local_c = FlagBoolean;
    break;
  case WasmFlag:
    local_c = FlagBoolean;
    break;
  case WasmI64Flag:
    local_c = FlagBoolean;
    break;
  case WasmFastArrayFlag:
    local_c = FlagBoolean;
    break;
  case WasmSharedArrayVirtualBufferFlag:
    local_c = FlagBoolean;
    break;
  case WasmMathExFilterFlag:
    local_c = FlagBoolean;
    break;
  case WasmCheckVersionFlag:
    local_c = FlagBoolean;
    break;
  case WasmAssignModuleIDFlag:
    local_c = FlagBoolean;
    break;
  case WasmIgnoreLimitsFlag:
    local_c = FlagBoolean;
    break;
  case WasmFoldFlag:
    local_c = FlagBoolean;
    break;
  case WasmIgnoreResponseFlag:
    local_c = FlagBoolean;
    break;
  case WasmMaxTableSizeFlag:
    local_c = FlagNumber;
    break;
  case WasmThreadsFlag:
    local_c = FlagBoolean;
    break;
  case WasmMultiValueFlag:
    local_c = FlagBoolean;
    break;
  case WasmSignExtendsFlag:
    local_c = FlagBoolean;
    break;
  case WasmNontrappingFlag:
    local_c = FlagBoolean;
    break;
  case WasmExperimentalFlag:
    local_c = FlagBoolean;
    break;
  case WasmSimdFlag:
    local_c = FlagBoolean;
    break;
  case AssertBreakFlag:
    local_c = FlagBoolean;
    break;
  case AssertPopUpFlag:
    local_c = FlagBoolean;
    break;
  case AssertIgnoreFlag:
    local_c = FlagBoolean;
    break;
  case AsyncDebuggingFlag:
    local_c = FlagBoolean;
    break;
  case BailOnNoProfileLimitFlag:
    local_c = FlagNumber;
    break;
  case BailOnNoProfileRejitLimitFlag:
    local_c = FlagNumber;
    break;
  case BaselineModeFlag:
    local_c = FlagBoolean;
    break;
  case DumpOnCrashFlag:
    local_c = FlagString;
    break;
  case FullMemoryDumpFlag:
    local_c = FlagString;
    break;
  case BailOutFlag:
    local_c = FlagNumberPairSet;
    break;
  case BailOutAtEveryLineFlag:
    local_c = FlagBoolean;
    break;
  case BailOutAtEveryByteCodeFlag:
    local_c = FlagBoolean;
    break;
  case BailOutAtEveryImplicitCallFlag:
    local_c = FlagBoolean;
    break;
  case BailOutByteCodeFlag:
    local_c = FlagNumberSet;
    break;
  case BenchmarkFlag:
    local_c = FlagBoolean;
    break;
  case BgJitFlag:
    local_c = FlagBoolean;
    break;
  case BgParseFlag:
    local_c = FlagBoolean;
    break;
  case BgJitDelayFlag:
    local_c = FlagNumber;
    break;
  case BgJitDelayFgBufferFlag:
    local_c = FlagNumber;
    break;
  case BgJitPendingFuncCapFlag:
    local_c = FlagNumber;
    break;
  case CreateFunctionProxyFlag:
    local_c = FlagBoolean;
    break;
  case HybridFgJitFlag:
    local_c = FlagBoolean;
    break;
  case HybridFgJitBgQueueLengthThresholdFlag:
    local_c = FlagNumber;
    break;
  case BytecodeHistFlag:
    local_c = FlagBoolean;
    break;
  case CurrentSourceInfoFlag:
    local_c = FlagBoolean;
    break;
  case CFGLogFlag:
    local_c = FlagBoolean;
    break;
  case CheckAlignmentFlag:
    local_c = FlagBoolean;
    break;
  case CheckEmitBufferPermissionsFlag:
    local_c = FlagBoolean;
    break;
  case CheckMemoryLeakFlag:
    local_c = FlagBoolean;
    break;
  case DumpOnLeakFlag:
    local_c = FlagString;
    break;
  case CheckOpHelpersFlag:
    local_c = FlagBoolean;
    break;
  case CloneInlinedPolymorphicCachesFlag:
    local_c = FlagBoolean;
    break;
  case ConcurrentRuntimeFlag:
    local_c = FlagBoolean;
    break;
  case ConstructorInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case ConstructorCallsRequiredToFinalizeCachedTypeFlag:
    local_c = FlagNumber;
    break;
  case PropertyCacheMissPenaltyFlag:
    local_c = FlagNumber;
    break;
  case PropertyCacheMissThresholdFlag:
    local_c = FlagNumber;
    break;
  case PropertyCacheMissResetFlag:
    local_c = FlagNumber;
    break;
  case CrashOnExceptionFlag:
    local_c = FlagBoolean;
    break;
  case DebugFlag:
    local_c = FlagBoolean;
    break;
  case DebugBreakFlag:
    local_c = FlagNumberSet;
    break;
  case StatementDebugBreakFlag:
    local_c = FlagNumberTrioSet;
    break;
  case DebugBreakOnPhaseBeginFlag:
    local_c = FlagPhases;
    break;
  case DebugWindowFlag:
    local_c = FlagBoolean;
    break;
  case ParserStateCacheFlag:
    local_c = FlagBoolean;
    break;
  case CompressParserStateCacheFlag:
    local_c = FlagBoolean;
    break;
  case DeferTopLevelTillFirstCallFlag:
    local_c = FlagBoolean;
    break;
  case DeferParseFlag:
    local_c = FlagNumber;
    break;
  case DirectCallTelemetryStatsFlag:
    local_c = FlagBoolean;
    break;
  case DisableArrayBTreeFlag:
    local_c = FlagBoolean;
    break;
  case DisableRentalThreadingFlag:
    local_c = FlagBoolean;
    break;
  case DisableVTuneSourceLineInfoFlag:
    local_c = FlagBoolean;
    break;
  case DisplayMemStatsFlag:
    local_c = FlagBoolean;
    break;
  case DumpFlag:
    local_c = FlagPhases;
    break;
  case DumpIRAddressesFlag:
    local_c = FlagBoolean;
    break;
  case DumpLineNoInColorFlag:
    local_c = FlagBoolean;
    break;
  case DumpObjectGraphOnExitFlag:
    local_c = FlagBoolean;
    break;
  case DumpObjectGraphOnCollectFlag:
    local_c = FlagBoolean;
    break;
  case DumpEvalStringOnRemovalFlag:
    local_c = FlagBoolean;
    break;
  case DumpObjectGraphOnEnumFlag:
    local_c = FlagBoolean;
    break;
  case DynamicProfileCacheFlag:
    local_c = FlagString;
    break;
  case DpcFlag:
    local_c = FlagString;
    break;
  case DynamicProfileCacheDirFlag:
    local_c = FlagString;
    break;
  case DynamicProfileInputFlag:
    local_c = FlagString;
    break;
  case DpiFlag:
    local_c = FlagString;
    break;
  case WininetProfileCacheFlag:
    local_c = FlagBoolean;
    break;
  case NoDynamicProfileInMemoryCacheFlag:
    local_c = FlagBoolean;
    break;
  case ProfileBasedSpeculativeJitFlag:
    local_c = FlagBoolean;
    break;
  case ProfileBasedSpeculationCapFlag:
    local_c = FlagNumber;
    break;
  case DynamicProfileMutatorDllFlag:
    local_c = FlagString;
    break;
  case DynamicProfileMutatorFlag:
    local_c = FlagString;
    break;
  case ExecuteByteCodeBufferReturnsInvalidByteCodeFlag:
    local_c = FlagBoolean;
    break;
  case ExpirableCollectionGCCountFlag:
    local_c = FlagNumber;
    break;
  case ExpirableCollectionTriggerThresholdFlag:
    local_c = FlagNumber;
    break;
  case SkipSplitOnNoResultFlag:
    local_c = FlagBoolean;
    break;
  case Force32BitByteCodeFlag:
    local_c = FlagBoolean;
    break;
  case CollectGarbageFlag:
    local_c = FlagBoolean;
    break;
  case IntlFlag:
    local_c = FlagBoolean;
    break;
  case IntlBuiltInsFlag:
    local_c = FlagBoolean;
    break;
  case IntlPlatformFlag:
    local_c = FlagBoolean;
    break;
  case JsBuiltInFlag:
    local_c = FlagBoolean;
    break;
  case JitReproFlag:
    local_c = FlagBoolean;
    break;
  case EntryPointInfoRpcDataFlag:
    local_c = FlagBoolean;
    break;
  case LdChakraLibFlag:
    local_c = FlagBoolean;
    break;
  case TestChakraLibFlag:
    local_c = FlagBoolean;
    break;
  case ES6Flag:
    local_c = FlagBoolean;
    break;
  case ES6AllFlag:
    local_c = FlagBoolean;
    break;
  case ES6ExperimentalFlag:
    local_c = FlagBoolean;
    break;
  case ES7AsyncAwaitFlag:
    local_c = FlagBoolean;
    break;
  case ES6DateParseFixFlag:
    local_c = FlagBoolean;
    break;
  case ES6FunctionNameFullFlag:
    local_c = FlagBoolean;
    break;
  case ES6GeneratorsFlag:
    local_c = FlagBoolean;
    break;
  case ES7ExponentiationOperatorFlag:
    local_c = FlagBoolean;
    break;
  case ES7ValuesEntriesFlag:
    local_c = FlagBoolean;
    break;
  case ES7TrailingCommaFlag:
    local_c = FlagBoolean;
    break;
  case ES6IsConcatSpreadableFlag:
    local_c = FlagBoolean;
    break;
  case ES6MathFlag:
    local_c = FlagBoolean;
    break;
  case ESDynamicImportFlag:
    local_c = FlagBoolean;
    break;
  case ES6ModuleFlag:
    local_c = FlagBoolean;
    break;
  case ES6ObjectFlag:
    local_c = FlagBoolean;
    break;
  case ES6NumberFlag:
    local_c = FlagBoolean;
    break;
  case ES6ObjectLiteralsFlag:
    local_c = FlagBoolean;
    break;
  case ES6ProxyFlag:
    local_c = FlagBoolean;
    break;
  case ES6RestFlag:
    local_c = FlagBoolean;
    break;
  case ES6SpreadFlag:
    local_c = FlagBoolean;
    break;
  case ES6StringFlag:
    local_c = FlagBoolean;
    break;
  case ES6StringPrototypeFixesFlag:
    local_c = FlagBoolean;
    break;
  case ES2018ObjectRestSpreadFlag:
    local_c = FlagBoolean;
    break;
  case ES6PrototypeChainFlag:
    local_c = FlagBoolean;
    break;
  case ES6ToPrimitiveFlag:
    local_c = FlagBoolean;
    break;
  case ES6ToLengthFlag:
    local_c = FlagBoolean;
    break;
  case ES6ToStringTagFlag:
    local_c = FlagBoolean;
    break;
  case ES6UnicodeFlag:
    local_c = FlagBoolean;
    break;
  case ES6UnicodeVerboseFlag:
    local_c = FlagBoolean;
    break;
  case ES6UnscopablesFlag:
    local_c = FlagBoolean;
    break;
  case ES6RegExStickyFlag:
    local_c = FlagBoolean;
    break;
  case ES2018RegExDotAllFlag:
    local_c = FlagBoolean;
    break;
  case ESExportNsAsFlag:
    local_c = FlagBoolean;
    break;
  case ES2018AsyncIterationFlag:
    local_c = FlagBoolean;
    break;
  case ESTopLevelAwaitFlag:
    local_c = FlagBoolean;
    break;
  case ES6RegExPrototypePropertiesFlag:
    local_c = FlagBoolean;
    break;
  case ES6RegExSymbolsFlag:
    local_c = FlagBoolean;
    break;
  case ES6VerboseFlag:
    local_c = FlagBoolean;
    break;
  case ESObjectGetOwnPropertyDescriptorsFlag:
    local_c = FlagBoolean;
    break;
  case ESSharedArrayBufferFlag:
    local_c = FlagBoolean;
    break;
  case ESBigIntFlag:
    local_c = FlagBoolean;
    break;
  case ESNumericSeparatorFlag:
    local_c = FlagBoolean;
    break;
  case ESNullishCoalescingOperatorFlag:
    local_c = FlagBoolean;
    break;
  case ESHashbangFlag:
    local_c = FlagBoolean;
    break;
  case ESSymbolDescriptionFlag:
    local_c = FlagBoolean;
    break;
  case ESArrayFindFromLastFlag:
    local_c = FlagBoolean;
    break;
  case ESPromiseAnyFlag:
    local_c = FlagBoolean;
    break;
  case ESImportMetaFlag:
    local_c = FlagBoolean;
    break;
  case ESGlobalThisFlag:
    local_c = FlagBoolean;
    break;
  case JitES6GeneratorsFlag:
    local_c = FlagBoolean;
    break;
  case FastLineColumnCalculationFlag:
    local_c = FlagBoolean;
    break;
  case FilenameFlag:
    local_c = FlagString;
    break;
  case FreeRejittedCodeFlag:
    local_c = FlagBoolean;
    break;
  case ForceGuardPagesFlag:
    local_c = FlagBoolean;
    break;
  case PrintGuardPageBoundsFlag:
    local_c = FlagBoolean;
    break;
  case ForceLegacyEngineFlag:
    local_c = FlagBoolean;
    break;
  case ForceFlag:
    local_c = FlagPhases;
    break;
  case StressFlag:
    local_c = FlagPhases;
    break;
  case ForceArrayBTreeFlag:
    local_c = FlagBoolean;
    break;
  case StrongArraySortFlag:
    local_c = FlagBoolean;
    break;
  case ForceCleanPropertyOnCollectFlag:
    local_c = FlagBoolean;
    break;
  case ForceCleanCacheOnCollectFlag:
    local_c = FlagBoolean;
    break;
  case ForceGCAfterJSONParseFlag:
    local_c = FlagBoolean;
    break;
  case ForceDecommitOnCollectFlag:
    local_c = FlagBoolean;
    break;
  case ForceDeferParseFlag:
    local_c = FlagBoolean;
    break;
  case ForceDiagnosticsModeFlag:
    local_c = FlagBoolean;
    break;
  case ForceGetWriteWatchOOMFlag:
    local_c = FlagBoolean;
    break;
  case ForcePostLowerGlobOptInstrStringFlag:
    local_c = FlagBoolean;
    break;
  case ForceSplitScopeFlag:
    local_c = FlagBoolean;
    break;
  case EnumerateSpecialPropertiesInDebuggerFlag:
    local_c = FlagBoolean;
    break;
  case EnableContinueAfterExceptionWrappersForHelpersFlag:
    local_c = FlagBoolean;
    break;
  case EnableContinueAfterExceptionWrappersForBuiltInsFlag:
    local_c = FlagBoolean;
    break;
  case EnableFunctionSourceReportForHeapEnumFlag:
    local_c = FlagBoolean;
    break;
  case ForceFragmentAddressSpaceFlag:
    local_c = FlagNumber;
    break;
  case ForceOOMOnEBCommitFlag:
    local_c = FlagNumber;
    break;
  case ForceDynamicProfileFlag:
    local_c = FlagBoolean;
    break;
  case ForceES5ArrayFlag:
    local_c = FlagBoolean;
    break;
  case ForceAsmJsLinkFailFlag:
    local_c = FlagBoolean;
    break;
  case ForceExpireOnNonCacheCollectFlag:
    local_c = FlagBoolean;
    break;
  case ForceFastPathFlag:
    local_c = FlagBoolean;
    break;
  case ForceFloatPrefFlag:
    local_c = FlagBoolean;
    break;
  case ForceJITLoopBodyFlag:
    local_c = FlagBoolean;
    break;
  case ForceStaticInterpreterThunkFlag:
    local_c = FlagBoolean;
    break;
  case DumpCommentsFromReferencedFilesFlag:
    local_c = FlagBoolean;
    break;
  case DelayFullJITSmallFuncFlag:
    local_c = FlagNumber;
    break;
  case EnableFatalErrorOnOOMFlag:
    local_c = FlagBoolean;
    break;
  case DeferLoadingAvailableSourceFlag:
    local_c = FlagBoolean;
    break;
  case ForceNativeFlag:
    local_c = FlagBoolean;
    break;
  case ForceSerializedFlag:
    local_c = FlagBoolean;
    break;
  case ForceSerializedBytecodeMajorVersionFlag:
    local_c = FlagNumber;
    break;
  case ForceSerializedBytecodeVersionSchemaFlag:
    local_c = FlagNumber;
    break;
  case ForceStrictModeFlag:
    local_c = FlagBoolean;
    break;
  case ForceUndoDeferFlag:
    local_c = FlagBoolean;
    break;
  case ForceBlockingConcurrentCollectFlag:
    local_c = FlagBoolean;
    break;
  case FreTestDiagModeFlag:
    local_c = FlagBoolean;
    break;
  case ByteCodeBranchLimitFlag:
    local_c = FlagNumber;
    break;
  case MediumByteCodeLayoutFlag:
    local_c = FlagBoolean;
    break;
  case LargeByteCodeLayoutFlag:
    local_c = FlagBoolean;
    break;
  case InduceCodeGenFailureFlag:
    local_c = FlagNumber;
    break;
  case InduceCodeGenFailureSeedFlag:
    local_c = FlagNumber;
    break;
  case InjectPartiallyInitializedInterpreterFrameErrorFlag:
    local_c = FlagNumber;
    break;
  case InjectPartiallyInitializedInterpreterFrameErrorTypeFlag:
    local_c = FlagNumber;
    break;
  case GenerateByteCodeBufferReturnsCantGenerateFlag:
    local_c = FlagBoolean;
    break;
  case GoptCleanupThresholdFlag:
    local_c = FlagNumber;
    break;
  case AsmGoptCleanupThresholdFlag:
    local_c = FlagNumber;
    break;
  case HighPrecisionDateFlag:
    local_c = FlagBoolean;
    break;
  case InlineCountMaxFlag:
    local_c = FlagNumber;
    break;
  case InlineCountMaxInLoopBodiesFlag:
    local_c = FlagNumber;
    break;
  case icminlbFlag:
    local_c = FlagNumber;
    break;
  case InlineInLoopBodyScaleDownFactorFlag:
    local_c = FlagNumber;
    break;
  case iilbsdfFlag:
    local_c = FlagNumber;
    break;
  case InlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case AggressiveInlineCountMaxFlag:
    local_c = FlagNumber;
    break;
  case AggressiveInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case InlineThresholdAdjustCountInLargeFunctionFlag:
    local_c = FlagNumber;
    break;
  case InlineThresholdAdjustCountInMediumSizedFunctionFlag:
    local_c = FlagNumber;
    break;
  case InlineThresholdAdjustCountInSmallFunctionFlag:
    local_c = FlagNumber;
    break;
  case AsmJsInlineAdjustFlag:
    local_c = FlagNumber;
    break;
  case InterpretFlag:
    local_c = FlagString;
    break;
  case InstrumentFlag:
    local_c = FlagPhases;
    break;
  case JitQueueThresholdFlag:
    local_c = FlagNumber;
    break;
  case LeakReportFlag:
    local_c = FlagString;
    break;
  case LoopInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case LeafInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case ConstantArgumentInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case RecursiveInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case RecursiveInlineDepthMaxFlag:
    local_c = FlagNumber;
    break;
  case RecursiveInlineDepthMinFlag:
    local_c = FlagNumber;
    break;
  case RedeferralCapFlag:
    local_c = FlagNumber;
    break;
  case LoopFlag:
    local_c = FlagNumber;
    break;
  case LoopInterpretCountFlag:
    local_c = FlagNumber;
    break;
  case licFlag:
    local_c = FlagNumber;
    break;
  case LoopProfileIterationsFlag:
    local_c = FlagNumber;
    break;
  case OutsideLoopInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case MaxFuncInlineDepthFlag:
    local_c = FlagNumber;
    break;
  case MaxNumberOfInlineesWithLoopFlag:
    local_c = FlagNumber;
    break;
  case MemspectFlag:
    local_c = FlagPhases;
    break;
  case PolymorphicInlineThresholdFlag:
    local_c = FlagNumber;
    break;
  case PrimeRecyclerFlag:
    local_c = FlagBoolean;
    break;
  case PrivateHeapFlag:
    local_c = FlagBoolean;
    break;
  case TraceEngineRefcountFlag:
    local_c = FlagBoolean;
    break;
  case LeakStackTraceFlag:
    local_c = FlagBoolean;
    break;
  case ForceMemoryLeakFlag:
    local_c = FlagBoolean;
    break;
  case DumpAfterFinalGCFlag:
    local_c = FlagBoolean;
    break;
  case ForceOldDateAPIFlag:
    local_c = FlagBoolean;
    break;
  case JitLoopBodyHotLoopThresholdFlag:
    local_c = FlagNumber;
    break;
  case LoopBodySizeThresholdToDisableOptsFlag:
    local_c = FlagNumber;
    break;
  case MaxJitThreadCountFlag:
    local_c = FlagNumber;
    break;
  case ForceMaxJitThreadCountFlag:
    local_c = FlagBoolean;
    break;
  case MitigateSpectreFlag:
    local_c = FlagBoolean;
    break;
  case AddMaskingBlocksFlag:
    local_c = FlagBoolean;
    break;
  case PoisonVarArrayLoadFlag:
    local_c = FlagBoolean;
    break;
  case PoisonIntArrayLoadFlag:
    local_c = FlagBoolean;
    break;
  case PoisonFloatArrayLoadFlag:
    local_c = FlagBoolean;
    break;
  case PoisonTypedArrayLoadFlag:
    local_c = FlagBoolean;
    break;
  case PoisonStringLoadFlag:
    local_c = FlagBoolean;
    break;
  case PoisonObjectsForLoadsFlag:
    local_c = FlagBoolean;
    break;
  case PoisonVarArrayStoreFlag:
    local_c = FlagBoolean;
    break;
  case PoisonIntArrayStoreFlag:
    local_c = FlagBoolean;
    break;
  case PoisonFloatArrayStoreFlag:
    local_c = FlagBoolean;
    break;
  case PoisonTypedArrayStoreFlag:
    local_c = FlagBoolean;
    break;
  case PoisonStringStoreFlag:
    local_c = FlagBoolean;
    break;
  case PoisonObjectsForStoresFlag:
    local_c = FlagBoolean;
    break;
  case MinInterpretCountFlag:
    local_c = FlagNumber;
    break;
  case MinSimpleJitRunCountFlag:
    local_c = FlagNumber;
    break;
  case MaxInterpretCountFlag:
    local_c = FlagNumber;
    break;
  case MicFlag:
    local_c = FlagNumber;
    break;
  case MaxSimpleJitRunCountFlag:
    local_c = FlagNumber;
    break;
  case MsjrcFlag:
    local_c = FlagNumber;
    break;
  case MinMemOpCountFlag:
    local_c = FlagNumber;
    break;
  case MmocFlag:
    local_c = FlagNumber;
    break;
  case MaxCopyOnAccessArrayLengthFlag:
    local_c = FlagNumber;
    break;
  case MinCopyOnAccessArrayLengthFlag:
    local_c = FlagNumber;
    break;
  case CopyOnAccessArraySegmentCacheSizeFlag:
    local_c = FlagNumber;
    break;
  case MinTemplatizedJitRunCountFlag:
    local_c = FlagNumber;
    break;
  case MinAsmJsInterpreterRunCountFlag:
    local_c = FlagNumber;
    break;
  case MinTemplatizedJitLoopRunCountFlag:
    local_c = FlagNumber;
    break;
  case MaxTemplatizedJitRunCountFlag:
    local_c = FlagNumber;
    break;
  case MtjrcFlag:
    local_c = FlagNumber;
    break;
  case MaxAsmJsInterpreterRunCountFlag:
    local_c = FlagNumber;
    break;
  case MaicFlag:
    local_c = FlagNumber;
    break;
  case AutoProfilingInterpreter0LimitFlag:
    local_c = FlagNumber;
    break;
  case ProfilingInterpreter0LimitFlag:
    local_c = FlagNumber;
    break;
  case AutoProfilingInterpreter1LimitFlag:
    local_c = FlagNumber;
    break;
  case SimpleJitLimitFlag:
    local_c = FlagNumber;
    break;
  case ProfilingInterpreter1LimitFlag:
    local_c = FlagNumber;
    break;
  case ExecutionModeLimitsFlag:
    local_c = FlagString;
    break;
  case EmlFlag:
    local_c = FlagString;
    break;
  case EnforceExecutionModeLimitsFlag:
    local_c = FlagBoolean;
    break;
  case EemlFlag:
    local_c = FlagBoolean;
    break;
  case SimpleJitAfterFlag:
    local_c = FlagNumber;
    break;
  case SjaFlag:
    local_c = FlagNumber;
    break;
  case FullJitAfterFlag:
    local_c = FlagNumber;
    break;
  case FjaFlag:
    local_c = FlagNumber;
    break;
  case NewSimpleJitFlag:
    local_c = FlagBoolean;
    break;
  case MaxLinearIntCaseCountFlag:
    local_c = FlagNumber;
    break;
  case MaxSingleCharStrJumpTableSizeFlag:
    local_c = FlagNumber;
    break;
  case MaxSingleCharStrJumpTableRatioFlag:
    local_c = FlagNumber;
    break;
  case MinSwitchJumpTableSizeFlag:
    local_c = FlagNumber;
    break;
  case MaxLinearStringCaseCountFlag:
    local_c = FlagNumber;
    break;
  case MinDeferredFuncTokenCountFlag:
    local_c = FlagNumber;
    break;
  case SkipFuncCountForBailOnNoProfileFlag:
    local_c = FlagNumber;
    break;
  case MaxJITFunctionBytecodeByteLengthFlag:
    local_c = FlagNumber;
    break;
  case MaxJITFunctionBytecodeCountFlag:
    local_c = FlagNumber;
    break;
  case MaxLoopsPerFunctionFlag:
    local_c = FlagNumber;
    break;
  case FuncObjectInlineCacheThresholdFlag:
    local_c = FlagNumber;
    break;
  case NoDeferParseFlag:
    local_c = FlagBoolean;
    break;
  case NoLogoFlag:
    local_c = FlagBoolean;
    break;
  case OOPJITMissingOptsFlag:
    local_c = FlagBoolean;
    break;
  case CrashOnOOPJITFailureFlag:
    local_c = FlagBoolean;
    break;
  case OOPCFGRegistrationFlag:
    local_c = FlagBoolean;
    break;
  case ForceJITCFGCheckFlag:
    local_c = FlagBoolean;
    break;
  case UseJITTrampolineFlag:
    local_c = FlagBoolean;
    break;
  case NoNativeFlag:
    local_c = FlagBoolean;
    break;
  case NopFrequencyFlag:
    local_c = FlagNumber;
    break;
  case NoStrictModeFlag:
    local_c = FlagBoolean;
    break;
  case NormalizeStatsFlag:
    local_c = FlagBoolean;
    break;
  case OffFlag:
    local_c = FlagPhases;
    break;
  case OffProfiledByteCodeFlag:
    local_c = FlagPhases;
    break;
  case OnFlag:
    local_c = FlagPhases;
    break;
  case OutputFileFlag:
    local_c = FlagString;
    break;
  case OutputFileOpenModeFlag:
    local_c = FlagString;
    break;
  case InMemoryTraceFlag:
    local_c = FlagBoolean;
    break;
  case InMemoryTraceBufferSizeFlag:
    local_c = FlagNumber;
    break;
  case TraceWithStackFlag:
    local_c = FlagBoolean;
    break;
  case PrintRunTimeDataCollectionTraceFlag:
    local_c = FlagBoolean;
    break;
  case PrejitFlag:
    local_c = FlagBoolean;
    break;
  case PrintSrcInDumpFlag:
    local_c = FlagBoolean;
    break;
  case ProfileDictionaryFlag:
    local_c = FlagNumber;
    break;
  case ProfileFlag:
    local_c = FlagPhases;
    break;
  case ProfileThresholdFlag:
    local_c = FlagNumber;
    break;
  case ProfileObjectLiteralFlag:
    local_c = FlagBoolean;
    break;
  case ProfileMemoryFlag:
    local_c = FlagString;
    break;
  case ProfileStringsFlag:
    local_c = FlagBoolean;
    break;
  case ProfileTypesFlag:
    local_c = FlagBoolean;
    break;
  case ProfileEvalMapFlag:
    local_c = FlagBoolean;
    break;
  case ProfileBailOutRecordMemoryFlag:
    local_c = FlagBoolean;
    break;
  case ValidateIntRangesFlag:
    local_c = FlagBoolean;
    break;
  case RejitMaxBailOutCountFlag:
    local_c = FlagNumber;
    break;
  case CallsToBailoutsRatioForRejitFlag:
    local_c = FlagNumber;
    break;
  case LoopIterationsToBailoutsRatioForRejitFlag:
    local_c = FlagNumber;
    break;
  case MinBailOutsBeforeRejitFlag:
    local_c = FlagNumber;
    break;
  case MinBailOutsBeforeRejitForLoopsFlag:
    local_c = FlagNumber;
    break;
  case LibraryStackFrameFlag:
    local_c = FlagBoolean;
    break;
  case LibraryStackFrameDebuggerFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerStressFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerBackgroundStressFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerConcurrentStressFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerConcurrentRepeatStressFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerPartialStressFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerTrackStressFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerInduceFalsePositivesFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerForceMarkInteriorFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerPriorityBoostTimeoutFlag:
    local_c = FlagNumber;
    break;
  case RecyclerThreadCollectTimeoutFlag:
    local_c = FlagNumber;
    break;
  case EnableConcurrentSweepAllocFlag:
    local_c = FlagBoolean;
    break;
  case ecsaFlag:
    local_c = FlagBoolean;
    break;
  case PageHeapFlag:
    local_c = FlagNumber;
    break;
  case PageHeapAllocStackFlag:
    local_c = FlagBoolean;
    break;
  case PageHeapFreeStackFlag:
    local_c = FlagBoolean;
    break;
  case PageHeapBucketNumberFlag:
    local_c = FlagNumberRange;
    break;
  case PageHeapBlockTypeFlag:
    local_c = FlagNumber;
    break;
  case PageHeapDecommitGuardPageFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerNoPageReuseFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerVerifyFlag:
    local_c = FlagPhases;
    break;
  case RecyclerVerifyPadSizeFlag:
    local_c = FlagNumber;
    break;
  case RecyclerTestFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerProtectPagesOnRescanFlag:
    local_c = FlagBoolean;
    break;
  case RecyclerVerifyMarkFlag:
    local_c = FlagBoolean;
    break;
  case LowMemoryCapFlag:
    local_c = FlagNumber;
    break;
  case NewPagesCapDuringBGSweepingFlag:
    local_c = FlagNumber;
    break;
  case AllocPolicyLimitFlag:
    local_c = FlagNumber;
    break;
  case RuntimeDataOutputFileFlag:
    local_c = FlagString;
    break;
  case SpeculationCapFlag:
    local_c = FlagNumber;
    break;
  case StatsFlag:
    local_c = FlagPhases;
    break;
  case SwallowExceptionsFlag:
    local_c = FlagBoolean;
    break;
  case PrintSystemExceptionFlag:
    local_c = FlagBoolean;
    break;
  case SwitchOptHolesThresholdFlag:
    local_c = FlagNumber;
    break;
  case TempMinFlag:
    local_c = FlagNumber;
    break;
  case TempMaxFlag:
    local_c = FlagNumber;
    break;
  case TraceFlag:
    local_c = FlagPhases;
    break;
  case LoopAlignNopLimitFlag:
    local_c = FlagNumber;
    break;
  case TraceMemoryFlag:
    local_c = FlagPhases;
    break;
  case TraceMetaDataParsingFlag:
    local_c = FlagNumber;
    break;
  case TraceWin8AllocationsFlag:
    local_c = FlagBoolean;
    break;
  case TraceWin8DeallocationsImmediateFlag:
    local_c = FlagBoolean;
    break;
  case PrintWin8StatsDetailedFlag:
    local_c = FlagBoolean;
    break;
  case TraceProtectPagesFlag:
    local_c = FlagBoolean;
    break;
  case TraceAsyncDebugCallsFlag:
    local_c = FlagBoolean;
    break;
  case TrackDispatchFlag:
    local_c = FlagBoolean;
    break;
  case VerboseFlag:
    local_c = FlagBoolean;
    break;
  case UseFullNameFlag:
    local_c = FlagBoolean;
    break;
  case Utf8Flag:
    local_c = FlagBoolean;
    break;
  case VersionFlag:
    local_c = FlagNumber;
    break;
  case WERExceptionSupportFlag:
    local_c = FlagBoolean;
    break;
  case ExtendedErrorStackForTestHostFlag:
    local_c = FlagBoolean;
    break;
  case errorStackTraceFlag:
    local_c = FlagBoolean;
    break;
  case DoHeapEnumOnEngineShutdownFlag:
    local_c = FlagBoolean;
    break;
  case RegexTracingFlag:
    local_c = FlagBoolean;
    break;
  case RegexProfileFlag:
    local_c = FlagBoolean;
    break;
  case RegexDebugFlag:
    local_c = FlagBoolean;
    break;
  case RegexDebugASTFlag:
    local_c = FlagBoolean;
    break;
  case RegexDebugAnnotatedASTFlag:
    local_c = FlagBoolean;
    break;
  case RegexBytecodeDebugFlag:
    local_c = FlagBoolean;
    break;
  case RegexOptimizeFlag:
    local_c = FlagBoolean;
    break;
  case DynamicRegexMruListSizeFlag:
    local_c = FlagNumber;
    break;
  case OptimizeForManyInstancesFlag:
    local_c = FlagBoolean;
    break;
  case EnableArrayTypeMutationFlag:
    local_c = FlagBoolean;
    break;
  case ArrayMutationTestSeedFlag:
    local_c = FlagNumber;
    break;
  case TestTraceFlag:
    local_c = FlagPhases;
    break;
  case EnableEvalMapCleanupFlag:
    local_c = FlagBoolean;
    break;
  case TraceObjectAllocationFlag:
    local_c = FlagBoolean;
    break;
  case SseFlag:
    local_c = FlagNumber;
    break;
  case DeletedPropertyReuseThresholdFlag:
    local_c = FlagNumber;
    break;
  case ForceStringKeyedSimpleDictionaryTypeHandlerFlag:
    local_c = FlagBoolean;
    break;
  case BigDictionaryTypeHandlerThresholdFlag:
    local_c = FlagNumber;
    break;
  case TypeSnapshotEnumerationFlag:
    local_c = FlagBoolean;
    break;
  case IsolatePrototypesFlag:
    local_c = FlagBoolean;
    break;
  case ChangeTypeOnProtoFlag:
    local_c = FlagBoolean;
    break;
  case ShareInlineCachesFlag:
    local_c = FlagBoolean;
    break;
  case DisableDebugObjectFlag:
    local_c = FlagBoolean;
    break;
  case DumpHeapFlag:
    local_c = FlagBoolean;
    break;
  case autoProxyFlag:
    local_c = FlagString;
    break;
  case PerfHintLevelFlag:
    local_c = FlagNumber;
    break;
  case MemProtectHeapStressFlag:
    local_c = FlagBoolean;
    break;
  case MemProtectHeapBackgroundStressFlag:
    local_c = FlagBoolean;
    break;
  case MemProtectHeapConcurrentStressFlag:
    local_c = FlagBoolean;
    break;
  case MemProtectHeapConcurrentRepeatStressFlag:
    local_c = FlagBoolean;
    break;
  case MemProtectHeapPartialStressFlag:
    local_c = FlagBoolean;
    break;
  case FixPropsOnPathTypesFlag:
    local_c = FlagBoolean;
    break;
  case BailoutTraceFilterFlag:
    local_c = FlagNumberSet;
    break;
  case RejitTraceFilterFlag:
    local_c = FlagNumberSet;
    break;
  case MaxBackgroundFinishMarkCountFlag:
    local_c = FlagNumber;
    break;
  case BackgroundFinishMarkWaitTimeFlag:
    local_c = FlagNumber;
    break;
  case MinBackgroundRepeatMarkRescanBytesFlag:
    local_c = FlagNumber;
    break;
  case ZeroMemoryWithNonTemporalStoreFlag:
    local_c = FlagBoolean;
    break;
  case MaxMarkStackPageCountFlag:
    local_c = FlagNumber;
    break;
  case MaxTrackedObjectListCountFlag:
    local_c = FlagNumber;
    break;
  case NumberAllocPlusSizeFlag:
    local_c = FlagNumber;
    break;
  case InitializeInterpreterSlotsWithInvalidStackVarFlag:
    local_c = FlagBoolean;
    break;
  case PRNGSeed0Flag:
    local_c = FlagNumber;
    break;
  case PRNGSeed1Flag:
    local_c = FlagNumber;
    break;
  case ClearInlineCachesOnCollectFlag:
    local_c = FlagBoolean;
    break;
  case InlineCacheInvalidationListCompactionThresholdFlag:
    local_c = FlagNumber;
    break;
  case ConstructorCacheInvalidationThresholdFlag:
    local_c = FlagNumber;
    break;
  case GCMemoryThresholdFlag:
    local_c = FlagNumber;
    break;
  case SimulatePolyCacheWithOneTypeForInlineCacheIndexFlag:
    local_c = FlagNumber;
    break;
  case JITServerIdleTimeoutFlag:
    local_c = FlagNumber;
    break;
  case JITServerMaxInactivePageAllocatorCountFlag:
    local_c = FlagNumber;
    break;
  case StrictWriteBarrierCheckFlag:
    local_c = FlagBoolean;
    break;
  case WriteBarrierTestFlag:
    local_c = FlagBoolean;
    break;
  case ForceSoftwareWriteBarrierFlag:
    local_c = FlagBoolean;
    break;
  case VerifyBarrierBitFlag:
    local_c = FlagBoolean;
    break;
  case EnableBGFreeZeroFlag:
    local_c = FlagBoolean;
    break;
  case KeepRecyclerTrackDataFlag:
    local_c = FlagBoolean;
    break;
  case MaxSingleAllocSizeInMBFlag:
    local_c = FlagNumber;
    break;
  default:
    local_c = InvalidFlagType;
  }
  return local_c;
}

Assistant:

FlagTypes
    ConfigFlagsTable::GetFlagType(Flag flag)
    {
        switch(flag)
        {
    #define FLAG(type, name, ...) \
            case name##Flag : \
                return Flag##type; \

    #include "ConfigFlagsList.h"

            default:
                return InvalidFlagType;
        }
    }